

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_power8_tm(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x80,"TFHAR",spr_read_tm,spr_write_tm,spr_read_tm,spr_write_tm,spr_read_tm,
                spr_write_tm,0);
  _spr_register(env,0x81,"TFIAR",spr_read_tm,spr_write_tm,spr_read_tm,spr_write_tm,spr_read_tm,
                spr_write_tm,0);
  _spr_register(env,0x82,"TEXASR",spr_read_tm,spr_write_tm,spr_read_tm,spr_write_tm,spr_read_tm,
                spr_write_tm,0);
  _spr_register(env,0x83,"TEXASRU",spr_read_tm_upper32,spr_write_tm_upper32,spr_read_tm_upper32,
                spr_write_tm_upper32,spr_read_tm_upper32,spr_write_tm_upper32,0);
  return;
}

Assistant:

static void gen_spr_power8_tm(CPUPPCState *env)
{
    spr_register_kvm(env, SPR_TFHAR, "TFHAR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TFHAR, 0x00000000);
    spr_register_kvm(env, SPR_TFIAR, "TFIAR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TFIAR, 0x00000000);
    spr_register_kvm(env, SPR_TEXASR, "TEXASR",
                     &spr_read_tm, &spr_write_tm,
                     &spr_read_tm, &spr_write_tm,
                     KVM_REG_PPC_TEXASR, 0x00000000);
    spr_register(env, SPR_TEXASRU, "TEXASRU",
                 &spr_read_tm_upper32, &spr_write_tm_upper32,
                 &spr_read_tm_upper32, &spr_write_tm_upper32,
                 0x00000000);
}